

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

int __thiscall
Assimp::Discreet3DSExporter::WriteHierarchy
          (Discreet3DSExporter *this,aiNode *node,int seq,int sibling_level)

{
  StreamWriterLE *writer;
  uint uVar1;
  uint uVar2;
  aiMesh *this_00;
  uint seq_00;
  uint i;
  ulong uVar3;
  short sVar4;
  aiNode *in_R8;
  uint uVar5;
  ChunkWriter chunk_1;
  ChunkWriter chunk_3;
  ChunkWriter chunk;
  ChunkWriter local_78;
  ulong local_68;
  ChunkWriter local_60;
  string local_50;
  
  writer = &this->writer;
  anon_unknown_0::ChunkWriter::ChunkWriter((ChunkWriter *)&local_50,writer,0xb002);
  anon_unknown_0::ChunkWriter::ChunkWriter(&local_78,writer,0xb010);
  WriteString(this,&node->mName);
  StreamWriter<false,_false>::Put<int>(writer,0);
  sVar4 = (short)sibling_level;
  if (sibling_level == -1) {
    sVar4 = (short)seq;
  }
  StreamWriter<false,_false>::Put<short>(writer,sVar4);
  anon_unknown_0::ChunkWriter::~ChunkWriter(&local_78);
  anon_unknown_0::ChunkWriter::~ChunkWriter((ChunkWriter *)&local_50);
  uVar5 = seq + 1;
  seq_00 = uVar5;
  for (uVar3 = 0; uVar3 < node->mNumChildren; uVar3 = uVar3 + 1) {
    seq_00 = WriteHierarchy(this,node->mChildren[uVar3],seq_00,-(uint)(uVar3 == 0) | uVar5);
  }
  local_68 = (ulong)seq_00;
  uVar3 = 0;
  while( true ) {
    if (node->mNumMeshes <= uVar3) break;
    uVar1 = node->mNumChildren;
    uVar2 = node->mMeshes[uVar3];
    this_00 = this->scene->mMeshes[(long)(ulong)uVar2];
    anon_unknown_0::ChunkWriter::ChunkWriter(&local_78,writer,0xb002);
    anon_unknown_0::ChunkWriter::ChunkWriter(&local_60,writer,0xb010);
    (anonymous_namespace)::GetMeshName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this_00,(aiMesh *)(ulong)uVar2,(uint)node,in_R8);
    WriteString(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    StreamWriter<false,_false>::Put<int>(writer,0);
    sVar4 = (short)local_68 + (short)uVar3;
    if (uVar1 != 0 || (int)uVar3 != 0) {
      sVar4 = (short)uVar5;
    }
    StreamWriter<false,_false>::Put<short>(writer,sVar4);
    anon_unknown_0::ChunkWriter::~ChunkWriter(&local_60);
    anon_unknown_0::ChunkWriter::~ChunkWriter(&local_78);
    uVar3 = uVar3 + 1;
  }
  return seq_00 + (int)uVar3;
}

Assistant:

int Discreet3DSExporter::WriteHierarchy(const aiNode& node, int seq, int sibling_level)
{
    // 3DS scene hierarchy is serialized as in http://www.martinreddy.net/gfx/3d/3DS.spec
    {
        ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKINFO);
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKOBJNAME);

            // Assimp node names are unique and distinct from all mesh-node
            // names we generate; thus we can use them as-is
            WriteString(node.mName);

            // Two unknown int16 values - it is even unclear if 0 is a safe value
            // but luckily importers do not know better either.
            writer.PutI4(0);

            int16_t hierarchy_pos = static_cast<int16_t>(seq);
            if (sibling_level != -1) {
                hierarchy_pos = sibling_level;
            }

            // Write the hierarchy position
            writer.PutI2(hierarchy_pos);
        }
    }

    // TODO: write transformation chunks

    ++seq;
    sibling_level = seq;

    // Write all children
    for (unsigned int i = 0; i < node.mNumChildren; ++i) {
        seq = WriteHierarchy(*node.mChildren[i], seq, i == 0 ? -1 : sibling_level);
    }

    // Write all meshes as separate nodes to be able to reference the meshes by name
    for (unsigned int i = 0; i < node.mNumMeshes; ++i) {
        const bool first_child = node.mNumChildren == 0 && i == 0;

        const unsigned int mesh_idx = node.mMeshes[i];
        const aiMesh& mesh = *scene->mMeshes[mesh_idx];

        ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKINFO);
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRACKOBJNAME);
            WriteString(GetMeshName(mesh, mesh_idx, node));

            writer.PutI4(0);
            writer.PutI2(static_cast<int16_t>(first_child ? seq : sibling_level));
            ++seq;
        }
    }
    return seq;
}